

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

bool EqualNode::ParameterToLong(char *param,long *outResult)

{
  bool bVar1;
  int *piVar2;
  long local_38;
  long result;
  char *pEnd;
  int base;
  char isNegative;
  long *outResult_local;
  char *param_local;
  
  pEnd._7_1_ = *param == '-';
  pEnd._0_4_ = 0;
  _base = outResult;
  outResult_local = (long *)param;
  bVar1 = cmHasLiteralPrefix<char_const*,3ul>((char **)&outResult_local,(char (*) [3])0x8c98d7);
  if ((bVar1) ||
     (bVar1 = cmHasLiteralPrefix<char_const*,3ul>((char **)&outResult_local,(char (*) [3])0x8c98db),
     bVar1)) {
    pEnd._0_4_ = 2;
    outResult_local = (long *)((long)outResult_local + 2);
  }
  else {
    bVar1 = cmHasLiteralPrefix<char_const*,4ul>((char **)&outResult_local,(char (*) [4])"-0b");
    if ((((bVar1) ||
         (bVar1 = cmHasLiteralPrefix<char_const*,4ul>((char **)&outResult_local,(char (*) [4])"-0B")
         , bVar1)) ||
        (bVar1 = cmHasLiteralPrefix<char_const*,4ul>((char **)&outResult_local,(char (*) [4])"+0b"),
        bVar1)) ||
       (bVar1 = cmHasLiteralPrefix<char_const*,4ul>((char **)&outResult_local,(char (*) [4])"+0B"),
       bVar1)) {
      pEnd._0_4_ = 2;
      outResult_local = (long *)((long)outResult_local + 3);
    }
  }
  local_38 = strtol((char *)outResult_local,(char **)&result,(int)pEnd);
  if ((((long *)result == outResult_local) || (*(char *)result != '\0')) ||
     (piVar2 = __errno_location(), *piVar2 == 0x22)) {
    param_local._7_1_ = false;
  }
  else {
    if ((pEnd._7_1_ != '\0') && (0 < local_38)) {
      local_38 = -local_38;
    }
    *_base = local_38;
    param_local._7_1_ = true;
  }
  return param_local._7_1_;
}

Assistant:

static bool ParameterToLong(const char* param, long* outResult)
  {
    const char isNegative = param[0] == '-';

    int base = 0;
    if (cmHasLiteralPrefix(param, "0b") || cmHasLiteralPrefix(param, "0B")) {
      base = 2;
      param += 2;
    } else if (cmHasLiteralPrefix(param, "-0b") ||
               cmHasLiteralPrefix(param, "-0B") ||
               cmHasLiteralPrefix(param, "+0b") ||
               cmHasLiteralPrefix(param, "+0B")) {
      base = 2;
      param += 3;
    }

    char* pEnd;
    long result = strtol(param, &pEnd, base);
    if (pEnd == param || *pEnd != '\0' || errno == ERANGE) {
      return false;
    }
    if (isNegative && result > 0) {
      result *= -1;
    }
    *outResult = result;
    return true;
  }